

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O0

parser_error parse_entry_parameter(parser *p)

{
  int iVar1;
  void *pvVar2;
  char *__s1;
  int local_30;
  wchar_t i;
  wchar_t n;
  char *name;
  embryonic_ui_entry *embryo;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if ((*(byte *)((long)pvVar2 + 0x1c) & 1) == 0) {
    __s1 = parser_getstr(p,"parameter");
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      iVar1 = strcmp(__s1,name_parameters[local_30].name);
      if (iVar1 == 0) {
        *(int *)((long)pvVar2 + 0x10) = local_30;
        return PARSE_ERROR_NONE;
      }
    }
    p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    p_local._4_4_ = PARSE_ERROR_INVALID_OPTION;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_entry_parameter(struct parser *p)
{
	struct embryonic_ui_entry *embryo = parser_priv(p);
	const char *name;
	int n = N_ELEMENTS(name_parameters);
	int i;

	if (!embryo) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/*
	 * Don't allow parameterization when editing an already existing entry.
	 */
	if (embryo->exists) {
		return PARSE_ERROR_INVALID_OPTION;
	}
	name = parser_getstr(p, "parameter");
	i = 0;
	while (1) {
		if (i >= n) {
			return PARSE_ERROR_INVALID_VALUE;
		}
		if (streq(name, name_parameters[i].name)) {
			embryo->param_index = i;
			break;
		}
		++i;
	}
	return PARSE_ERROR_NONE;
}